

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

void wirehair::AddInvertibleGF2Matrix(uint64_t *matrix,uint offset,uint pitchWords,uint n)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  sbyte sVar5;
  uint in_ECX;
  ulong uVar6;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t word;
  uint64_t temp;
  uint written0;
  uint64_t temp0;
  uint64_t word0;
  uint64_t prev;
  uint target;
  uint64_t *dest;
  uint row_i;
  uint64_t *row;
  uint shift;
  PCGRandom prng;
  uint8_t seed;
  uint column_j;
  uint column_i;
  uint ii;
  uint64_t *row_1;
  uint32_t rv2_1;
  uint32_t rv1_1;
  uint32_t rv2;
  uint32_t rv1;
  uint32_t rot_1;
  uint32_t xorshifted_1;
  uint64_t oldstate_1;
  uint32_t rot;
  uint32_t xorshifted;
  uint64_t oldstate;
  uint32_t rot_3;
  uint32_t xorshifted_3;
  uint64_t oldstate_3;
  uint32_t rot_2;
  uint32_t xorshifted_2;
  uint64_t oldstate_2;
  ulong local_118;
  ulong local_110;
  uint local_104;
  ulong local_100;
  ulong local_f0;
  uint local_e4;
  ulong *local_e0;
  uint local_d4;
  ulong *local_d0;
  PCGRandom local_c0;
  byte local_ad;
  uint local_a4;
  long local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  long local_88;
  
  if (in_ECX < 0x200) {
    local_ad = kInvertibleMatrixSeeds[in_ECX];
    local_94 = in_ECX;
    local_90 = in_EDX;
    local_8c = in_ESI;
    local_88 = in_RDI;
    PCGRandom::PCGRandom(&local_c0);
    PCGRandom::Seed(&local_c0,(ulong)local_ad,0);
    uVar2 = local_8c & 0x3f;
    local_d0 = (ulong *)(local_88 + (ulong)(local_8c >> 6) * 8);
    for (local_d4 = 0; local_d4 < local_94; local_d4 = local_d4 + 1) {
      uVar3 = (uint)((local_c0.State >> 0x12 ^ local_c0.State) >> 0x1b);
      bVar1 = (byte)(local_c0.State >> 0x38);
      uVar6 = local_c0.State * 0x5851f42d4c957f2d + local_c0.Inc;
      uVar4 = (uint)((local_c0.State >> 0x12 ^ local_c0.State) >> 0x1b);
      local_f0 = CONCAT44(uVar4 >> (bVar1 >> 3) | uVar4 << (-(bVar1 >> 3) & 0x1f),
                          uVar3 >> (bVar1 >> 3) | uVar3 << (-(bVar1 >> 3) & 0x1f));
      local_104 = 0x40 - uVar2;
      local_100 = local_f0;
      if ((local_94 < 0x40) &&
         (local_100 = (1L << ((byte)local_94 & 0x3f)) - 1U & local_f0, local_94 < local_104)) {
        local_104 = local_94;
      }
      sVar5 = (sbyte)uVar2;
      *local_d0 = local_100 << sVar5 ^ *local_d0;
      local_e4 = local_94 - local_104;
      local_c0.State = uVar6;
      local_e0 = local_d0;
      if (local_e4 != 0) {
        while( true ) {
          local_e0 = local_e0 + 1;
          local_110 = 0;
          if (uVar2 != 0) {
            local_110 = local_f0 >> (0x40U - sVar5 & 0x3f);
          }
          local_118 = 0;
          if (uVar2 < local_e4) {
            uVar3 = (uint)((local_c0.State >> 0x12 ^ local_c0.State) >> 0x1b);
            bVar1 = (byte)(local_c0.State >> 0x38);
            uVar4 = (uint)((local_c0.State >> 0x12 ^ local_c0.State) >> 0x1b);
            local_118 = CONCAT44(uVar4 >> (bVar1 >> 3) | uVar4 << (-(bVar1 >> 3) & 0x1f),
                                 uVar3 >> (bVar1 >> 3) | uVar3 << (-(bVar1 >> 3) & 0x1f));
            local_110 = local_118 << sVar5 | local_110;
            local_c0.State = local_c0.State * 0x5851f42d4c957f2d + local_c0.Inc;
          }
          if (local_e4 < 0x40) {
            local_110 = (1L << ((byte)local_e4 & 0x3f)) - 1U & local_110;
          }
          *local_e0 = local_110 ^ *local_e0;
          if (local_e4 < 0x41) break;
          local_e4 = local_e4 - 0x40;
          local_f0 = local_118;
        }
      }
      local_d0 = local_d0 + local_90;
    }
  }
  else {
    local_a0 = in_RDI;
    for (local_a4 = 0; local_a4 < in_ECX; local_a4 = local_a4 + 1) {
      uVar2 = in_ESI + local_a4;
      *(ulong *)(local_a0 + (ulong)(uVar2 >> 6) * 8) =
           1L << ((byte)uVar2 & 0x3f) ^ *(ulong *)(local_a0 + (ulong)(uVar2 >> 6) * 8);
      if (local_a4 + 1 < in_ECX) {
        uVar6 = (ulong)(uVar2 + 1 >> 6);
        *(ulong *)(local_a0 + uVar6 * 8) =
             1L << ((byte)(uVar2 + 1) & 0x3f) ^ *(ulong *)(local_a0 + uVar6 * 8);
      }
      local_a0 = local_a0 + (ulong)in_EDX * 8;
    }
  }
  return;
}

Assistant:

void AddInvertibleGF2Matrix(
    uint64_t * GF256_RESTRICT matrix, ///< Address of upper left word
    const unsigned offset, ///< Offset in bits to the first sum column
    const unsigned pitchWords, ///< Pitch of the matrix in words
    const unsigned n ///< Number of bits in the matrix to generate
)
{
    // If we do not have this value of n in the table:
    if (n >= kMatrixSeedCount)
    {
        uint64_t * row = matrix;

        // For each row:
        for (unsigned ii = 0; ii < n; ++ii, row += pitchWords)
        {
            // Flip diagonal bit
            const unsigned column_i = offset + ii;
            row[column_i >> 6] ^= (uint64_t)1 << (column_i & 63);

            // Flip an off-diagonal bit also
            if (ii + 1 < n) {
                const unsigned column_j = column_i + 1;
                row[column_j >> 6] ^= (uint64_t)1 << (column_j & 63);
            }
        }

        return;
    }

    // Pull a random matrix out of the lookup table
    const uint8_t seed = kInvertibleMatrixSeeds[n];

    PCGRandom prng;
    prng.Seed(seed);

    const unsigned shift = offset & 63;
    uint64_t * row = matrix + (offset >> 6);

    // For each row to generate:
    for (unsigned row_i = 0; row_i < n; ++row_i, row += pitchWords)
    {
        uint64_t * dest = row;
        unsigned target = n;

        // Unroll the first word
        uint64_t prev = 0;

        // Generate first word
        const uint64_t word0 = Random64(prng);

        uint64_t temp0 = word0;

        unsigned written0 = 64 - shift;

        // Handle short writes
        if (target < 64) {
            temp0 &= ((uint64_t)1 << target) - 1;
            if (written0 > target) {
                written0 = target;
            }
        }

        // Add partial word into front
        *dest++ ^= temp0 << shift;

        target -= written0;
        prev = word0;

        if (target <= 0) {
            continue;
        }

        // For each remaining word:
        for (;;)
        {
            uint64_t temp = 0;
            if (shift != 0) {
                temp = prev >> (64 - shift);
            }
            uint64_t word = 0;

            // If it needs another word:
            if (target > shift) {
                // Generate next word
                word = Random64(prng);
                temp |= (word << shift);
            }

            if (target < 64) {
                temp &= ((uint64_t)1 << target) - 1;
            }

            // Add partial word
            *dest ^= temp;

            if (target <= 64) {
                break;
            }

            target -= 64;
            ++dest;
            prev = word;
        }
    }
}